

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O2

bool __thiscall
ithipublisher::GetNameOrNumberList
          (ithipublisher *this,char *metric_name,
          vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list,bool is_number)

{
  ithipublisher *piVar1;
  vector<_metric_name_line,_std::allocator<_metric_name_line>_> *this_00;
  int iVar2;
  code *__comp;
  _metric_line *p_Var3;
  pointer pp_Var4;
  ulong uVar5;
  char *__s2;
  pointer pp_Var6;
  ulong uVar7;
  ulong uVar8;
  double local_78;
  value_type local_68;
  ithipublisher *local_48;
  char *local_40;
  vector<_metric_name_line,_std::allocator<_metric_name_line>_> *local_38;
  
  local_68.average = 0.0;
  local_68.name = (char *)0x0;
  local_68.current = 0.0;
  pp_Var6 = (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pp_Var4 = (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)pp_Var4 - (long)pp_Var6 >> 3;
  __s2 = (char *)0x0;
  local_48 = this;
  local_40 = metric_name;
  local_38 = name_list;
  for (uVar5 = 0; uVar8 = uVar7, uVar7 != uVar5; uVar5 = uVar5 + 1) {
    p_Var3 = pp_Var6[uVar5];
    iVar2 = strcmp(p_Var3->metric_name,local_40);
    uVar8 = uVar5;
    if (0 < iVar2) break;
    if (iVar2 == 0) {
      __s2 = p_Var3->key_value;
      local_68.name = __s2;
      break;
    }
  }
  this_00 = local_38;
  local_78 = 0.0;
  for (; uVar8 < (ulong)((long)pp_Var4 - (long)pp_Var6 >> 3); uVar8 = uVar8 + 1) {
    p_Var3 = pp_Var6[uVar8];
    iVar2 = strcmp(p_Var3->metric_name,local_40);
    piVar1 = local_48;
    if (iVar2 != 0) break;
    if (__s2 == (char *)0x0) {
      __s2 = (char *)0x0;
    }
    else {
      iVar2 = strcmp(p_Var3->key_value,__s2);
      if (iVar2 != 0) {
        if (1 < (long)piVar1->nb_months) {
          local_68.average = local_78 / (double)((long)piVar1->nb_months + -1);
        }
        std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::push_back
                  (this_00,&local_68);
        pp_Var6 = (piVar1->line_list).
                  super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __s2 = pp_Var6[uVar8]->key_value;
        local_68.current = 0.0;
        local_68.average = 0.0;
        p_Var3 = pp_Var6[uVar8];
        local_78 = 0.0;
        local_68.name = __s2;
      }
    }
    if ((p_Var3->year == piVar1->last_year) && (p_Var3->month == piVar1->last_month)) {
      local_68.current = p_Var3->frequency;
    }
    else {
      local_78 = local_78 + p_Var3->frequency;
    }
    pp_Var4 = (piVar1->line_list).
              super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (__s2 != (char *)0x0) {
    if (1 < (long)local_48->nb_months) {
      local_68.average = local_78 / (double)((long)local_48->nb_months + -1);
    }
    std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>::push_back(this_00,&local_68)
    ;
  }
  __comp = MetricNameLineIsBigger;
  if (is_number) {
    __comp = MetricNumberIsLower;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_metric_name_line,_metric_name_line)>>
            ((this_00->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (this_00->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
             _M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(_metric_name_line,__metric_name_line)>)__comp);
  return true;
}

Assistant:

bool ithipublisher::GetNameOrNumberList(char const * metric_name, std::vector<MetricNameLine>* name_list, bool is_number)
{
    size_t line_index = 0;
    double sum = 0;
    MetricNameLine current_name = { NULL, 0, 0 };

    /* Skip to beginning of the metric */
    while (line_index < line_list.size())
    {
        int cmp = strcmp(line_list[line_index]->metric_name, metric_name);

        if (cmp > 0)
        {
            break;
        }
        else if (cmp == 0)
        {
            current_name.name = line_list[line_index]->key_value;
            break;
        }
        line_index++;
    }

    /* Extract the lines and compute the averages */
    while (line_index < line_list.size() && strcmp(line_list[line_index]->metric_name, metric_name) == 0)
    {
        if (current_name.name != NULL && strcmp(line_list[line_index]->key_value, current_name.name) != 0)
        {
            if (nb_months > 1)
            {
                current_name.average = sum / (((size_t)nb_months) - 1);
            }
            name_list->push_back(current_name);
            current_name.name = line_list[line_index]->key_value;
            current_name.average = 0;
            current_name.current = 0;
            sum = 0;
        }
        
        if (line_list[line_index]->year == last_year &&
            line_list[line_index]->month == last_month)
        {
            current_name.current = line_list[line_index]->frequency;
        }
        else
        {
            sum += line_list[line_index]->frequency;
        }

        line_index++;
    }
    /* Push the last entry if it was filled up */
    if (current_name.name != NULL)
    {
        if (nb_months > 1)
        {
            current_name.average = sum / (((size_t)nb_months) - 1);
        }
        name_list->push_back(current_name);
    }

    if (is_number) {
        /* Sort by increasing metric number */
        std::sort(name_list->begin(), name_list->end(), ithipublisher::MetricNumberIsLower);
    } else {
        /* Sort from bigger to lower */
        std::sort(name_list->begin(), name_list->end(), ithipublisher::MetricNameLineIsBigger);
    }

    return true;
}